

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::range_detail::indirected_range<std::vector<std::unique_ptr<signed_char,std::default_delete<signed_char>>,std::allocator<std::unique_ptr<signed_char,std::default_delete<signed_char>>>>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  ostream *stream;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  stream = tlssPush();
  filldata<boost::range_detail::indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>_>
  ::fill(stream,(indirected_range<std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>
                 *)this);
  tlssPop();
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  String::String(&SStack_78,"{?}");
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }